

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O1

void __thiscall
pbrt::UniformGridMediumProvider::UniformGridMediumProvider
          (UniformGridMediumProvider *this,Bounds3f *bounds,
          optional<pbrt::SampledGrid<float>_> *dgrid,
          optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *rgbgrid,
          RGBColorSpace *colorSpace,SpectrumHandle *Le,SampledGrid<float> *Legrid,Allocator alloc)

{
  undefined8 uVar1;
  size_t sVar2;
  float fVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_38;
  
  fVar3 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar3;
  fVar3 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  uVar1 = *(undefined8 *)&(bounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x =
       (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
  *(undefined8 *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar1;
  pstd::optional<pbrt::SampledGrid<float>_>::optional(&this->densityGrid,dgrid);
  pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::optional
            (&this->rgbDensityGrid,rgbgrid);
  this->colorSpace = colorSpace;
  local_38.bits =
       (Le->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->Le_spec,(SpectrumHandle *)&local_38,0x168,0x33e,alloc);
  (this->LeScaleGrid).values.alloc.memoryResource = (Legrid->values).alloc.memoryResource;
  (this->LeScaleGrid).values.ptr = (float *)0x0;
  (this->LeScaleGrid).values.nAlloc = 0;
  (this->LeScaleGrid).values.nStored = 0;
  sVar2 = (Legrid->values).nStored;
  (this->LeScaleGrid).values.nAlloc = (Legrid->values).nAlloc;
  (this->LeScaleGrid).values.nStored = sVar2;
  (this->LeScaleGrid).values.ptr = (Legrid->values).ptr;
  (Legrid->values).nStored = 0;
  (Legrid->values).ptr = (float *)0x0;
  (Legrid->values).nAlloc = 0;
  (this->LeScaleGrid).nz = Legrid->nz;
  iVar4 = Legrid->ny;
  (this->LeScaleGrid).nx = Legrid->nx;
  (this->LeScaleGrid).ny = iVar4;
  lVar5 = (this->LeScaleGrid).values.nStored * 4 + *(long *)(in_FS_OFFSET + -0x1f8);
  *(long *)(in_FS_OFFSET + -0x1f8) = lVar5;
  if ((this->densityGrid).set == false) {
    if ((this->rgbDensityGrid).set == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2c8dc3c);
    }
    lVar6 = 4;
    lVar7 = 0x68;
  }
  else {
    lVar6 = 2;
    lVar7 = 0x30;
  }
  *(long *)(in_FS_OFFSET + -0x1f8) =
       (*(long *)((long)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x + lVar7) << lVar6)
       + lVar5;
  return;
}

Assistant:

UniformGridMediumProvider::UniformGridMediumProvider(
    const Bounds3f &bounds, pstd::optional<SampledGrid<Float>> dgrid,
    pstd::optional<SampledGrid<RGBUnboundedSpectrum>> rgbgrid,
    const RGBColorSpace *colorSpace, SpectrumHandle Le, SampledGrid<Float> Legrid,
    Allocator alloc)
    : bounds(bounds),
      densityGrid(std::move(dgrid)),
      rgbDensityGrid(std::move(rgbgrid)),
      colorSpace(colorSpace),
      Le_spec(Le, alloc),
      LeScaleGrid(std::move(Legrid)) {
    volumeGridBytes += LeScaleGrid.BytesAllocated();
    volumeGridBytes +=
        densityGrid ? densityGrid->BytesAllocated() : rgbDensityGrid->BytesAllocated();
}